

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::visit(Executor *this,FunctionCallNode *node)

{
  pointer pcVar1;
  int iVar2;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> _Var3;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar4;
  string name;
  RuntimeVariableAnalyser variableAnalyser;
  RuntimeFunctionAnalyser functionAnalyser;
  string local_c0;
  RuntimeVariableAnalyser local_a0;
  RuntimeFunctionAnalyser local_68;
  
  pcVar1 = (node->name_)._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (node->name_)._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_c0);
  if (iVar2 == 0) {
    handlePrint(this,node);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_c0);
    if (iVar2 == 0) {
      handleIf(this,node);
    }
    else {
      oVar4 = Context::lookup(&this->context_,&local_c0,0);
      _Var3 = oVar4.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
              _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
              _M_payload;
      RuntimeFunctionAnalyser::RuntimeFunctionAnalyser(&local_68);
      if (((undefined1  [16])
           oVar4.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
           super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> &
          (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__throw_bad_optional_access();
      }
      (**(code **)(*(long *)_Var3 + 0x10))(_Var3,&local_68);
      if (local_68.symbolValid_ == true) {
        handleFunctionCall(this,node,&local_68);
      }
      else {
        RuntimeVariableAnalyser::RuntimeVariableAnalyser(&local_a0);
        (**(code **)(*(long *)_Var3 + 0x10))(_Var3,&local_a0);
        handleVariableCall(this,node,&local_a0);
        local_a0.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor =
             (_func_int **)&PTR__RuntimeVariableAnalyser_001e9768;
        if (local_a0.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      local_68.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor =
           (_func_int **)&PTR__RuntimeFunctionAnalyser_001e9798;
      if (local_68.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::__cxx11::
      _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
      ::_M_clear(&local_68.arguments_.
                  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                );
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Executor::visit(const FunctionCallNode& node)
{
  const auto name = node.getName();
  if(name == "print")
    handlePrint(node);
  else if(name == "if")
    handleIf(node);
  else
  {
    const auto symbol = context_.lookup(name);
    auto functionAnalyser = RuntimeFunctionAnalyser{};
    symbol.value().get().accept(functionAnalyser);

    if(functionAnalyser.isSymbolValid())
    {
      handleFunctionCall(node, functionAnalyser);
    }
    else
    {
      auto variableAnalyser = RuntimeVariableAnalyser{};
      symbol.value().get().accept(variableAnalyser);
      handleVariableCall(node, variableAnalyser);
    }
  }
}